

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_point.cpp
# Opt level: O1

int emmyHelperInit(lua_State *L)

{
  int iVar1;
  
  lua_getglobal(L,ExtensionPoint::ExtensionTable_abi_cxx11_._M_dataplus._M_p);
  iVar1 = (*lua_type)(L,-1);
  if (iVar1 == 5) {
    (*lua_pushcclosure)(L,createNode,0);
    (*lua_setfield)(L,-2,"createNode");
  }
  return 0;
}

Assistant:

int emmyHelperInit(lua_State* L)
{
	lua_getglobal(L, ExtensionPoint::ExtensionTable.c_str());
	if (lua_istable(L, -1))
	{
		// create node
		lua_pushcfunction(L, createNode);
		lua_setfield(L, -2, "createNode");
	}
	return 0;
}